

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboTestUtil::Texture2DShader::shadeFragments
          (Texture2DShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  Texture2D *this_00;
  int iVar1;
  const_reference pvVar2;
  size_type sVar3;
  float x_;
  float y_;
  Vector<float,_4> *local_1f8;
  Vector<float,_4> *local_1d8;
  float *local_1b8;
  undefined1 local_1b0 [8];
  UVec4 uicolor;
  IVec4 icolor;
  undefined1 local_180 [8];
  Vec4 color;
  int fragNdx_3;
  Vector<float,_4> local_15c;
  int local_14c;
  undefined1 local_148 [4];
  int fragNdx_2;
  Vec4 tmpColors [4];
  Vec4 bias;
  Vec4 scale;
  Texture2D *tex;
  int ndx;
  undefined8 local_d4;
  int local_cc;
  Vector<float,_2> VStack_c8;
  int fragNdx_1;
  undefined1 local_c0 [8];
  Vec4 coord;
  int fragNdx;
  int packetNdx;
  Vec4 colors [4];
  Vec2 texCoords [4];
  Vec4 outBias;
  Vec4 outScale;
  FragmentShadingContext *context_local;
  int numPackets_local;
  FragmentPacket *packets_local;
  Texture2DShader *this_local;
  
  pvVar2 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                     (&(this->super_ShaderProgram).m_uniforms,0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(outBias.m_data + 2),(float (*) [4])&pvVar2->value);
  pvVar2 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                     (&(this->super_ShaderProgram).m_uniforms,1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(texCoords + 3),(float (*) [4])&pvVar2->value);
  local_1b8 = colors[3].m_data + 2;
  do {
    tcu::Vector<float,_2>::Vector((Vector<float,_2> *)local_1b8);
    local_1b8 = local_1b8 + 2;
  } while ((Vec2 *)local_1b8 != texCoords + 3);
  local_1d8 = (Vector<float,_4> *)&fragNdx;
  do {
    tcu::Vector<float,_4>::Vector(local_1d8);
    local_1d8 = local_1d8 + 1;
  } while (local_1d8 != (Vector<float,_4> *)(colors[3].m_data + 2));
  for (coord.m_data[3] = 0.0; (int)coord.m_data[3] < numPackets;
      coord.m_data[3] = (float)((int)coord.m_data[3] + 1)) {
    for (coord.m_data[2] = 0.0; (int)coord.m_data[2] < 4;
        coord.m_data[2] = (float)((int)coord.m_data[2] + 1)) {
      rr::readTriangleVarying<float>
                ((rr *)local_c0,packets + (int)coord.m_data[3],context,0,(int)coord.m_data[2]);
      x_ = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_c0);
      y_ = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_c0);
      tcu::Vector<float,_2>::Vector(&stack0xffffffffffffff38,x_,y_);
      *&texCoords[(long)(int)coord.m_data[2] + -1].m_data = VStack_c8.m_data;
    }
    for (local_cc = 0; local_cc < 4; local_cc = local_cc + 1) {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)&tex + 4),0.0);
      *(undefined8 *)(&fragNdx + (long)local_cc * 4) = stack0xffffffffffffff24;
      *(undefined8 *)colors[local_cc].m_data = local_d4;
    }
    for (tex._0_4_ = 0; iVar1 = (int)tex,
        sVar3 = std::
                vector<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
                ::size(&this->m_inputs), iVar1 < (int)sVar3; tex._0_4_ = (int)tex + 1) {
      pvVar2 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                         (&(this->super_ShaderProgram).m_uniforms,(long)((int)tex * 3 + 2));
      this_00 = (pvVar2->sampler).tex2D;
      pvVar2 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                         (&(this->super_ShaderProgram).m_uniforms,(long)((int)tex * 3 + 3));
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(bias.m_data + 2),(float (*) [4])&pvVar2->value);
      pvVar2 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                         (&(this->super_ShaderProgram).m_uniforms,(long)((int)tex * 3 + 4));
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(tmpColors[3].m_data + 2),(float (*) [4])&pvVar2->value);
      local_1f8 = (Vector<float,_4> *)local_148;
      do {
        tcu::Vector<float,_4>::Vector(local_1f8);
        local_1f8 = local_1f8 + 1;
      } while (local_1f8 != (Vector<float,_4> *)(tmpColors[3].m_data + 2));
      sglr::rc::Texture2D::sample4(this_00,(Vec4 *)local_148,(Vec2 *)(colors[3].m_data + 2),0.0);
      for (local_14c = 0; local_14c < 4; local_14c = local_14c + 1) {
        tcu::operator*((tcu *)(color.m_data + 3),
                       (Vector<float,_4> *)(local_148 + (long)local_14c * 0x10),
                       (Vector<float,_4> *)(bias.m_data + 2));
        tcu::operator+((tcu *)&local_15c,(Vector<float,_4> *)(color.m_data + 3),
                       (Vector<float,_4> *)(tmpColors[3].m_data + 2));
        tcu::Vector<float,_4>::operator+=
                  ((Vector<float,_4> *)(&fragNdx + (long)local_14c * 4),&local_15c);
      }
    }
    for (color.m_data[2] = 0.0; (int)color.m_data[2] < 4;
        color.m_data[2] = (float)((int)color.m_data[2] + 1)) {
      tcu::operator*((tcu *)(icolor.m_data + 2),
                     (Vector<float,_4> *)(&fragNdx + (long)(int)color.m_data[2] * 4),
                     (Vector<float,_4> *)(outBias.m_data + 2));
      tcu::operator+((tcu *)local_180,(Vector<float,_4> *)(icolor.m_data + 2),
                     (Vector<float,_4> *)(texCoords + 3));
      castVectorSaturate<int>((FboTestUtil *)(uicolor.m_data + 2),(Vec4 *)local_180);
      castVectorSaturate<unsigned_int>((FboTestUtil *)local_1b0,(Vec4 *)local_180);
      if (this->m_outputType == TYPE_FLOAT_VEC4) {
        rr::writeFragmentOutput<tcu::Vector<float,4>>
                  (context,(int)coord.m_data[3],(int)color.m_data[2],0,(Vector<float,_4> *)local_180
                  );
      }
      else if (this->m_outputType == TYPE_INT_VEC4) {
        rr::writeFragmentOutput<tcu::Vector<int,4>>
                  (context,(int)coord.m_data[3],(int)color.m_data[2],0,
                   (Vector<int,_4> *)(uicolor.m_data + 2));
      }
      else if (this->m_outputType == TYPE_UINT_VEC4) {
        rr::writeFragmentOutput<tcu::Vector<unsigned_int,4>>
                  (context,(int)coord.m_data[3],(int)color.m_data[2],0,
                   (Vector<unsigned_int,_4> *)local_1b0);
      }
    }
  }
  return;
}

Assistant:

void Texture2DShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4 outScale (m_uniforms[0].value.f4);
	const tcu::Vec4 outBias	 (m_uniforms[1].value.f4);

	tcu::Vec2 texCoords[4];
	tcu::Vec4 colors[4];

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		// setup tex coords
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4	coord = rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
			texCoords[fragNdx] = tcu::Vec2(coord.x(), coord.y());
		}

		// clear result
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			colors[fragNdx] = tcu::Vec4(0.0f);

		// sample each texture
		for (int ndx = 0; ndx < (int)m_inputs.size(); ndx++)
		{
			const sglr::rc::Texture2D*	tex		= m_uniforms[2 + ndx*3].sampler.tex2D;
			const tcu::Vec4				scale	(m_uniforms[2 + ndx*3 + 1].value.f4);
			const tcu::Vec4				bias	(m_uniforms[2 + ndx*3 + 2].value.f4);
			tcu::Vec4 tmpColors[4];

			tex->sample4(tmpColors, texCoords);

			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
				colors[fragNdx] += tmpColors[fragNdx] * scale + bias;
		}

		// write out
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4		color	= colors[fragNdx] * outScale + outBias;
			const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
			const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

			if (m_outputType == glu::TYPE_FLOAT_VEC4)			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
			else if (m_outputType == glu::TYPE_INT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
			else if (m_outputType == glu::TYPE_UINT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
			else
				DE_ASSERT(DE_FALSE);
		}
	}
}